

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O3

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::try_to_store_message_to_queue
          (mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
           *this,type_index *msg_type,message_ref_t *message,invocation_type_t demand_type)

{
  limited_dynamic_demand_queue *queue;
  overflow_reaction_t oVar1;
  tracer_t *tracer_00;
  _Map_pointer ppdVar2;
  long lVar3;
  _Elt_pointer args_5;
  anon_class_24_3_b3d561ce lambda;
  long lVar4;
  type_index **pptVar5;
  anon_class_16_2_f638b178 __p;
  bool queue_full;
  deliver_op_tracer tracer;
  unique_lock<std::mutex> lock;
  type_index *in_stack_ffffffffffffff50;
  bool local_a1;
  type_index *local_a0;
  composed_action_name local_98;
  type_index *local_88 [2];
  deliver_op_tracer local_78;
  condition_variable *local_50;
  unique_lock<std::mutex> local_48;
  text_separator local_38;
  
  tracer_00 = (this->super_mchain_tracing_enabled_base).m_tracer;
  pptVar5 = (type_index **)0x248cb1;
  if (demand_type == event) {
    pptVar5 = (type_index **)0x247053;
  }
  local_48._M_device = &this->m_lock;
  local_48._M_owns = false;
  local_a0 = msg_type;
  local_78.m_tracer = tracer_00;
  local_78.m_chain = &this->super_abstract_message_chain_t;
  local_78.m_op_name = (char *)pptVar5;
  local_78.m_msg_type = msg_type;
  local_78.m_message = message;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  if (this->m_status == closed) goto LAB_0020e69f;
  ppdVar2 = (this->m_queue).m_queue.
            super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_a1 = (this->m_queue).m_max_size ==
             ((long)(this->m_queue).m_queue.
                    super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(this->m_queue).m_queue.
                    super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
             ((long)(this->m_queue).m_queue.
                    super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(this->m_queue).m_queue.
                    super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
             (((long)ppdVar2 -
               (long)(this->m_queue).m_queue.
                     super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
             (ulong)(ppdVar2 == (_Map_pointer)0x0)) * 0x15;
  if (local_a1) {
    lVar3 = (this->m_capacity).m_overflow_timeout.__r;
    if (lVar3 != 0) {
      local_50 = &this->m_overflow_cond;
      lVar4 = std::chrono::_V2::steady_clock::now();
      local_98.m_1 = (char *)(lVar4 + lVar3);
      __p.queue_full = &local_a1;
      __p.this = this;
      std::condition_variable::
      wait_until<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>,so_5::mchain_props::mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::try_to_store_message_to_queue(std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_1_>
                (local_50,&local_48,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)&local_98,__p);
      if ((local_a1 & 1U) == 0) goto LAB_0020e687;
    }
    oVar1 = (this->m_capacity).m_overflow_reaction;
    if (oVar1 == throw_exception) {
      local_98.m_2 = "overflow.throw_exception";
      local_98.m_1 = (char *)pptVar5;
      impl::msg_tracing_helpers::details::
      make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
                (tracer_00,&this->super_abstract_message_chain_t,&local_98,local_a0,message);
      local_98.m_1 = (char *)local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,
                 "an attempt to push message to full mchain with overflow_reaction_t::throw_exception policy"
                 ,"");
      exception_t::raise(0x248f28);
      if ((type_index **)local_98.m_1 != local_88) {
        operator_delete(local_98.m_1);
      }
    }
    else {
      if (oVar1 != remove_oldest) {
        if (oVar1 != drop_newest) {
          local_98.m_1 = (char *)&local_78;
          local_88[0] = local_a0;
          lambda.this = (mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
                         *)local_a0;
          lambda.tracer = (deliver_op_tracer *)this;
          lambda.msg_type = in_stack_ffffffffffffff50;
          local_98.m_2 = (char *)this;
          so_5::details::
          invoke_noexcept_code<so_5::mchain_props::mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::try_to_store_message_to_queue(std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_2_>
                    (lambda);
          abort();
        }
        local_98.m_2 = "overflow.drop_newest";
        local_98.m_1 = (char *)pptVar5;
        impl::msg_tracing_helpers::details::
        make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
                  (tracer_00,&this->super_abstract_message_chain_t,&local_98,local_a0,message);
        goto LAB_0020e69f;
      }
      queue = &this->m_queue;
      details::ensure_queue_not_empty<so_5::mchain_props::details::limited_dynamic_demand_queue&>
                (queue);
      args_5 = (this->m_queue).m_queue.
               super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_38.m_text = "removed:";
      local_98.m_1 = local_78.m_op_name;
      local_98.m_2 = "overflow.remove_oldest";
      impl::msg_tracing_helpers::details::
      make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::impl::msg_tracing_helpers::details::text_separator,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
                (local_78.m_tracer,local_78.m_chain,&local_98,local_78.m_msg_type,local_78.m_message
                 ,&local_38,&args_5->m_msg_type,&args_5->m_message_ref);
      details::ensure_queue_not_empty<so_5::mchain_props::details::limited_dynamic_demand_queue&>
                (queue);
      std::deque<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>::
      pop_front(&queue->m_queue);
    }
  }
LAB_0020e687:
  complete_store_message_to_queue(this,&local_78,local_a0,message,demand_type);
LAB_0020e69f:
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return;
}

Assistant:

void
		try_to_store_message_to_queue(
			const std::type_index & msg_type,
			const message_ref_t & message,
			invocation_type_t demand_type )
			{
				typename TRACING_BASE::deliver_op_tracer tracer{
						*this, // as tracing base.
						*this, // as chain.
						msg_type,
						message,
						demand_type };

				std::unique_lock< std::mutex > lock{ m_lock };

				// Message cannot be stored to closed chain.
				if( details::status::closed == m_status )
					return;

				// If queue full and waiting on full queue is enabled we
				// must wait for some time until there will be some space in
				// the queue.
				bool queue_full = m_queue.is_full();
				if( queue_full && m_capacity.is_overflow_timeout_defined() )
					{
						m_overflow_cond.wait_for(
								lock,
								m_capacity.overflow_timeout(),
								[this, &queue_full] {
									queue_full = m_queue.is_full();
									return !queue_full ||
											details::status::closed == m_status;
								} );
					}

				// If queue still full we must perform some reaction.
				if( queue_full )
					{
						const auto reaction = m_capacity.overflow_reaction();
						if( overflow_reaction_t::drop_newest == reaction )
							{
								// New message must be simply ignored.
								tracer.overflow_drop_newest();
								return;
							}
						else if( overflow_reaction_t::remove_oldest == reaction )
							{
								// The oldest message must be simply removed.
								tracer.overflow_remove_oldest( m_queue.front() );
								m_queue.pop_front();
							}
						else if( overflow_reaction_t::throw_exception == reaction )
							{
								tracer.overflow_throw_exception();
								SO_5_THROW_EXCEPTION(
										rc_msg_chain_overflow,
										"an attempt to push message to full mchain "
										"with overflow_reaction_t::throw_exception policy" );
							}
						else
							{
								so_5::details::abort_on_fatal_error( [&] {
										tracer.overflow_throw_exception();
										SO_5_LOG_ERROR( m_env, log_stream ) {
											log_stream << "overflow_reaction_t::abort_app "
													"will be performed for mchain (id="
													<< m_id << "), msg_type: "
													<< msg_type.name()
													<< ". Application will be aborted"
													<< std::endl;
										}
									} );
							}
					}

				complete_store_message_to_queue(
						tracer,
						msg_type,
						message,
						demand_type );
			}